

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloca.hpp
# Opt level: O2

void __thiscall
libtorrent::aux::alloca_destructor<char>::~alloca_destructor(alloca_destructor<char> *this)

{
  char *pcVar1;
  
  if ((0x1000 < (this->objects).m_len) && (pcVar1 = (this->objects).m_ptr, pcVar1 != (char *)0x0)) {
    operator_delete__(pcVar1);
    return;
  }
  return;
}

Assistant:

~alloca_destructor()
	{
		if (objects.size() > cutoff)
		{
			delete [] objects.data();
		}
		else
		{
			for (auto& o : objects)
			{
				TORRENT_UNUSED(o);
				o.~T();
			}
		}
	}